

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O0

void chapter2::display_elem(vector<int,_std::allocator<int>_> *ivec,string *title,ostream *os)

{
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  int local_24;
  int ix;
  ostream *os_local;
  string *title_local;
  vector<int,_std::allocator<int>_> *ivec_local;
  
  poVar1 = std::operator<<(os,(string *)title);
  std::operator<<(poVar1,'\n');
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(ivec);
    if (sVar2 <= (ulong)(long)local_24) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](ivec,(long)local_24);
    poVar1 = (ostream *)std::ostream::operator<<(os,*pvVar3);
    std::operator<<(poVar1,' ');
    local_24 = local_24 + 1;
  }
  std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void display_elem(vector<int> &ivec, const string &title, ostream &os) {
        os << title << '\n';
        for (int ix = 0; ix < ivec.size(); ++ix) {
            os << ivec[ix] << ' ';
        }

        os << endl;
    }